

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostinfo.cpp
# Opt level: O0

void __thiscall
QHostInfoResult::QHostInfoResult(QHostInfoResult *this,QObject *receiver,SlotObjUniquePtr *slot)

{
  undefined8 uVar1;
  QObject *in_RSI;
  QObject *in_RDI;
  QObject *in_stack_ffffffffffffffb8;
  QObject *this_00;
  
  QObject::QObject(in_RDI,(QObject *)0x0);
  *(undefined ***)in_RDI = &PTR_metaObject_0049b3d8;
  this_00 = in_RDI;
  if (in_RSI != (QObject *)0x0) {
    this_00 = in_RSI;
  }
  QPointer<const_QObject>::QPointer<void>
            ((QPointer<const_QObject> *)this_00,in_stack_ffffffffffffffb8);
  std::unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>::unique_ptr
            ((unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> *)this_00,
             (unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> *)
             in_stack_ffffffffffffffb8);
  QPointer<const_QObject>::operator->((QPointer<const_QObject> *)0x21bd9b);
  uVar1 = QObject::thread();
  QObject::moveToThread(in_RDI,uVar1);
  return;
}

Assistant:

QHostInfoResult::QHostInfoResult(const QObject *receiver, QtPrivate::SlotObjUniquePtr slot)
    : receiver{receiver ? receiver : this}, slotObj{std::move(slot)}
{
    Q_ASSERT(this->receiver);
    moveToThread(this->receiver->thread());
}